

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::NegativeGLSLLinkTimeErrors::Run(NegativeGLSLLinkTimeErrors *this)

{
  bool bVar1;
  GLuint GVar2;
  allocator<char> local_d1;
  string local_d0;
  GLuint local_ac;
  char *pcStack_a8;
  GLuint p2;
  char *glsl_cs2;
  long error;
  char *src_1 [2];
  char *pcStack_78;
  GLuint sh_1;
  char *src [2];
  GLuint sh;
  allocator<char> local_51;
  string local_50;
  GLuint local_2c;
  char *pcStack_28;
  GLuint p;
  char *glsl_fs;
  char *glsl_vs;
  char *glsl_cs;
  NegativeGLSLLinkTimeErrors *this_local;
  
  glsl_vs = 
  "\nlayout(local_size_x = 1, local_size_y = 1) in;\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
  ;
  glsl_fs = 
  "\nlayout(location = 0) in mediump vec4 g_position;\nvoid main() {\n  gl_Position = g_position;\n}"
  ;
  pcStack_28 = 
  "\nlayout(location = 0) out mediump vec4 g_color;\nvoid main() {\n  g_color = vec4(1);\n}";
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "\nlayout(local_size_x = 1, local_size_y = 1) in;\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
             ,&local_51);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_2c = GVar2;
  src[1]._0_4_ = glu::CallLogWrapper::glCreateShader
                           (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                             super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,local_2c,(GLuint)src[1]);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,(GLuint)src[1]);
  pcStack_78 = "#version 310 es\n";
  src[0] = 
  "\nlayout(location = 0) in mediump vec4 g_position;\nvoid main() {\n  gl_Position = g_position;\n}"
  ;
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,(GLuint)src[1],2,&stack0xffffffffffffff88,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,(GLuint)src[1]);
  GVar2 = glu::CallLogWrapper::glCreateShader
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,local_2c,GVar2);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,GVar2);
  error = (long)anon_var_dwarf_54dfa2;
  src_1[0] = 
  "\nlayout(location = 0) out mediump vec4 g_color;\nvoid main() {\n  g_color = vec4(1);\n}";
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,GVar2,2,(GLchar **)&error,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,GVar2);
  glsl_cs2 = (char *)0x0;
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,local_2c);
  bVar1 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,local_2c,(bool *)0x0);
  if (bVar1) {
    glsl_cs2 = &DAT_ffffffffffffffff;
  }
  pcStack_a8 = 
  "\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "\nlayout(std430) buffer Output {\n  vec4 data;\n} g_out;\nvoid main() {\n  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);\n}"
             ,&local_d1);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_ac = GVar2;
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,GVar2);
  bVar1 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,local_ac,(bool *)0x0);
  if (bVar1) {
    glsl_cs2 = &DAT_ffffffffffffffff;
  }
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,local_2c);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,local_ac);
  return (long)glsl_cs2;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1, local_size_y = 1) in;" NL "layout(std430) buffer Output {" NL "  vec4 data;" NL
			   "} g_out;" NL "void main() {" NL "  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);" NL "}";
		const char* const glsl_vs = NL "layout(location = 0) in mediump vec4 g_position;" NL "void main() {" NL
									   "  gl_Position = g_position;" NL "}";
		const char* const glsl_fs =
			NL "layout(location = 0) out mediump vec4 g_color;" NL "void main() {" NL "  g_color = vec4(1);" NL "}";

		GLuint p = CreateComputeProgram(glsl_cs);

		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, glsl_vs };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		{
			const GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, glsl_fs };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		long error = NO_ERROR;
		glLinkProgram(p);
		if (CheckProgram(p))
			error = ERROR;

		/* no layout */
		const char* const glsl_cs2 = NL "layout(std430) buffer Output {" NL "  vec4 data;" NL "} g_out;" NL
										"void main() {" NL "  g_out.data = vec4(1.0, 2.0, 3.0, 4.0);" NL "}";

		GLuint p2 = CreateComputeProgram(glsl_cs2);
		glLinkProgram(p2);
		if (CheckProgram(p2))
			error = ERROR;

		glDeleteProgram(p);
		glDeleteProgram(p2);
		return error;
	}